

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  Bounds<long> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffff18;
  BinaryBuffer *in_stack_ffffffffffffff20;
  Bounds<long> *this;
  Bounds<long> *x;
  BinaryBuffer *bb_00;
  value_type *in_stack_ffffffffffffff40;
  BinaryBuffer in_stack_ffffffffffffff48;
  vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_> *in_stack_ffffffffffffff50;
  Bounds<long> *local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bb_00 = (BinaryBuffer *)&stack0xffffffffffffff48;
  this = in_RSI;
  x = local_18;
  Bounds<long>::Bounds((Bounds<long> *)0x17b725);
  std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>::resize
            (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48._vptr_BinaryBuffer,
             in_stack_ffffffffffffff40);
  Bounds<long>::~Bounds(this);
  if (local_18 != (Bounds<long> *)0x0) {
    std::vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_>::operator[]
              ((vector<diy::Bounds<long>,_std::allocator<diy::Bounds<long>_>_> *)in_RSI,0);
    load<diy::Bounds<long>>(bb_00,x,(size_t)this);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }